

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNodeList.h
# Opt level: O0

SyntaxToken * __thiscall
psy::C::
CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
::lastToken(SyntaxToken *__return_storage_ptr__,
           CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
           *this)

{
  SyntaxNode *this_00;
  SpecifierSyntax *node;
  CoreSyntaxNodeList<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
  *this_local;
  
  this_00 = &List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
             ::lastValue(&this->
                          super_List<psy::C::SpecifierSyntax_*,_psy::C::SyntaxNodePlainList<psy::C::SpecifierSyntax_*>_>
                        )->super_SyntaxNode;
  if (this_00 == (SyntaxNode *)0x0) {
    SyntaxToken::invalid();
  }
  else {
    C::SyntaxNode::lastToken(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual SyntaxToken lastToken() const override
    {
        SyntaxNodeT node = this->lastValue();
        if (node)
            return node->lastToken();
        return SyntaxToken::invalid();
    }